

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::AppendStringFallback
          (EpsCopyInputStream *this,char *ptr,int size,string *str)

{
  LogMessage *other;
  char *pcVar1;
  int iVar2;
  LogFinisher local_69;
  LogMessage local_68;
  
  if ((long)size <= (long)(this->buffer_end_ + ((long)this->limit_ - (long)ptr))) {
    std::__cxx11::string::reserve((ulong)str);
  }
  iVar2 = (*(int *)&this->buffer_end_ - (int)ptr) + 0x10;
  while( true ) {
    if (size <= iVar2) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "src/../third_party/protobuf-lite/google/protobuf/parse_context.h",0x143);
      other = LogMessage::operator<<(&local_68,"CHECK failed: size > chunk_size: ");
      LogFinisher::operator=(&local_69,other);
      LogMessage::~LogMessage(&local_68);
    }
    size = size - iVar2;
    if (((this->next_chunk_ == (char *)0x0) ||
        (std::__cxx11::string::append((char *)str,(ulong)ptr), this->limit_ < 0x11)) ||
       (pcVar1 = Next(this), pcVar1 == (char *)0x0)) break;
    ptr = pcVar1 + 0x10;
    iVar2 = (*(int *)&this->buffer_end_ - (int)ptr) + 0x10;
    if (size <= iVar2) {
      std::__cxx11::string::append((char *)str,(ulong)ptr);
      return ptr + size;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* EpsCopyInputStream::AppendStringFallback(const char* ptr, int size,
                                                     std::string* str) {
  if (PROTOBUF_PREDICT_TRUE(size <= buffer_end_ - ptr + limit_)) {
    // Reserve the string up to a static safe size. If strings are bigger than
    // this we proceed by growing the string as needed. This protects against
    // malicious payloads making protobuf hold on to a lot of memory.
    str->reserve(str->size() + std::min<int>(size, kSafeStringSize));
  }
  return AppendSize(ptr, size,
                    [str](const char* p, int s) { str->append(p, s); });
}